

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:373:61)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:373:61)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  void *pvVar1;
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffe0,v);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  *(undefined1 *)((long)pvVar1 + 0x1c) = 0;
  value::value(__return_storage_ptr__,(object_ptr *)&stack0xffffffffffffffe0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }